

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool __thiscall ON_NurbsCurve::IsNatural(ON_NurbsCurve *this,int end)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int side;
  uint uVar7;
  uint i;
  double dVar8;
  double dVar9;
  ON_BezierCurve span;
  ON_Interval domain;
  ON_3dVector D2;
  ON_3dPoint CV2;
  ON_3dPoint CV0;
  ON_3dVector D1;
  ON_3dPoint P;
  ON_BezierCurve local_d8;
  ON_Interval local_b8;
  ON_3dVector local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dVector local_60;
  ON_3dPoint local_48;
  
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  uVar7 = end - 3;
  if ((uint)end < 3) {
    i = end & 1;
    bVar4 = (bool)((byte)end & uVar7 < 0xfffffffe);
    bVar3 = 0;
    do {
      ON_BezierCurve::ON_BezierCurve(&local_d8);
      iVar6 = this->m_cv_count - this->m_order;
      if (i == 0) {
        iVar6 = 0;
      }
      bVar1 = ConvertSpanToBezier(this,iVar6,&local_d8);
      if (bVar1 && 1 < local_d8.m_order) {
        iVar6 = local_d8.m_order + -1;
        if (i == 0) {
          iVar6 = 0;
        }
        side = (uint)(i == 0) * 2 + -1;
        bVar1 = 2 < local_d8.m_order;
        bVar2 = ON_BezierCurve::GetCV(&local_d8,iVar6,&local_78);
        if (bVar2) {
          bVar1 = ON_BezierCurve::GetCV(&local_d8,(side << bVar1) + iVar6,&local_90);
          if (!bVar1) goto LAB_00544f0f;
          dVar8 = ON_Interval::operator[](&local_b8,i);
          ON_Curve::Ev2Der(&this->super_ON_Curve,dVar8,&local_48,&local_60,&local_a8,side,(int *)0x0
                          );
          dVar8 = ON_3dVector::Length(&local_a8);
          dVar9 = ON_3dPoint::DistanceTo(&local_78,&local_90);
          cVar5 = dVar8 <= dVar9 * 1e-08;
          if ((bool)cVar5) {
            bVar3 = 1;
          }
        }
        else {
          cVar5 = (char)(0 << bVar1);
        }
      }
      else {
LAB_00544f0f:
        cVar5 = '\0';
      }
      ON_BezierCurve::~ON_BezierCurve(&local_d8);
      if (cVar5 == '\0') break;
      bVar1 = i != 0;
      i = i + 1;
      bVar4 = bVar1 || uVar7 < 0xfffffffe;
    } while (!bVar1 && uVar7 >= 0xfffffffe);
    bVar4 = (bool)(bVar4 & bVar3);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ON_NurbsCurve::IsNatural(int end) const
{
  bool rc = false;
  ON_3dPoint CV0, CV2, P;
  ON_3dVector D1, D2;
  const ON_Interval domain(Domain());
  for (int pass = ((0==end||2==end) ? 0 : 1); pass < ((1==end||2==end)?2 : 1); ++pass)
  {
    ON_BezierCurve span;
    if (false == ConvertSpanToBezier(((0 == pass) ? 0 : (m_cv_count - m_order)), span) || span.m_order < 2)
      return false;
    int i0 = (0 == pass) ? 0 : span.m_order - 1;
    int di = (0 == pass) ? 1 : -1;
    if (span.m_order > 2)
      di *= 2;
    if (false == span.GetCV(i0, CV0))
      return false;
    if (false == span.GetCV(i0 + di, CV2))
      return false;
    Ev2Der(domain[pass], P, D1, D2, (0 == pass) ? 1 : -1);
    const double d2 = D2.Length();
    const double tol = CV0.DistanceTo(CV2)*1.0e-8;
    if (false == (d2 <= tol))
      return false;
    rc = true;      
  }
  return rc;
}